

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O0

void init_decimation_info_3d
               (uint x_texels,uint y_texels,uint z_texels,uint x_weights,uint y_weights,
               uint z_weights,decimation_info *di,dt_init_working_buffers *wb)

{
  byte bVar1;
  undefined1 uVar2;
  uint uVar3;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  int in_R9D;
  undefined1 *in_stack_00000008;
  long in_stack_00000010;
  int j_5;
  uint i_6;
  uint weights_per_block_simd;
  uint8_t last_texel;
  int last_texel_count_wt;
  uint j_4;
  uint i_5;
  uint texels_per_block_simd;
  uint j_3;
  uint8_t last_texel_1;
  float dttwf;
  uint8_t dttw;
  uint k;
  uint texel_1;
  uint j_2;
  uint texel_count_wt;
  uint i_4;
  uint j_1;
  uint j;
  uint i_3;
  uint8_t max_texel_weight_count;
  uint i_2;
  int w3;
  int w2;
  int w1;
  int w0;
  int s2;
  int s1;
  int NM;
  int N;
  int cas;
  int fp;
  int ft;
  int fs;
  int weight [4];
  int qweight [4];
  int z_weight_int;
  int y_weight_int;
  int x_weight_int;
  int z_weight_frac;
  int y_weight_frac;
  int x_weight_frac;
  int z_weight;
  int y_weight;
  int x_weight;
  int texel;
  uint x;
  uint y;
  uint z;
  uint i_1;
  uint i;
  uint8_t max_texel_count_of_weight;
  uint weights_per_block;
  uint texels_per_block;
  int local_120;
  uint local_11c;
  uint local_10c;
  uint local_108;
  uint local_100;
  uint local_f0;
  uint local_e8;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uchar local_cd;
  uint local_cc;
  uint local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_98 [4];
  int local_88 [6];
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  byte local_31;
  uint local_30;
  uint local_2c;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  local_2c = in_EDI * in_ESI * in_EDX;
  local_30 = in_ECX * in_R8D * in_R9D;
  local_31 = 0;
  if (local_30 == 0) {
    __assert_fail("weights_per_block > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_block_sizes.cpp"
                  ,0x1c3,
                  "void init_decimation_info_3d(unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, decimation_info &, dt_init_working_buffers &)"
                 );
  }
  if (local_2c == 0) {
    __assert_fail("texels_per_block > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_block_sizes.cpp"
                  ,0x1c4,
                  "void init_decimation_info_3d(unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, decimation_info &, dt_init_working_buffers &)"
                 );
  }
  for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
    *(undefined1 *)(in_stack_00000010 + 0x798 + (ulong)local_38) = 0;
  }
  for (local_3c = 0; local_3c < local_2c; local_3c = local_3c + 1) {
    *(undefined1 *)(in_stack_00000010 + (ulong)local_3c) = 0;
  }
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_ESI;
  local_14 = in_EDI;
  for (local_40 = 0; local_40 < local_1c; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < local_18; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < local_14; local_48 = local_48 + 1) {
        local_4c = (local_40 * local_18 + local_44) * local_14 + local_48;
        local_50 = (((local_14 >> 1) + 0x400) / (local_14 - 1)) * local_48 * (local_20 + -1) + 0x20
                   >> 6;
        local_54 = (((local_18 >> 1) + 0x400) / (local_18 - 1)) * local_44 * (local_24 + -1) + 0x20
                   >> 6;
        local_58 = (((local_1c >> 1) + 0x400) / (local_1c - 1)) * local_40 * (local_28 + -1) + 0x20
                   >> 6;
        local_5c = local_50 & 0xf;
        local_60 = local_54 & 0xf;
        local_64 = local_58 & 0xf;
        local_68 = (int)local_50 >> 4;
        local_6c = (int)local_54 >> 4;
        local_70 = (int)local_58 >> 4;
        local_88[0] = (local_70 * local_24 + local_6c) * local_20 + local_68;
        local_88[3] = local_68 + 1 + (local_6c + 1 + (local_70 + 1) * local_24) * local_20;
        local_b8 = local_20 * local_24;
        local_c8 = local_5c;
        local_b4 = local_b8;
        switch((local_64 < local_60) * '\x02' + (local_60 < local_5c) * '\x04' | local_64 < local_5c
              ) {
        case '\0':
          local_b8 = local_20;
          local_bc = 0x10 - local_64;
          local_c0 = local_64 - local_60;
          local_c4 = local_60 - local_5c;
          break;
        default:
          local_b8 = local_20;
          local_bc = 0x10 - local_64;
          local_c0 = local_64 - local_60;
          local_c4 = local_60 - local_5c;
          break;
        case '\x02':
          local_b4 = local_20;
          local_bc = 0x10 - local_60;
          local_c0 = local_60 - local_64;
          local_c4 = local_64 - local_5c;
          break;
        case '\x03':
          local_b4 = local_20;
          local_b8 = 1;
          local_bc = 0x10 - local_60;
          local_c0 = local_60 - local_5c;
          local_c4 = local_5c - local_64;
          local_c8 = local_64;
          break;
        case '\x04':
          local_b8 = 1;
          local_bc = 0x10 - local_64;
          local_c0 = local_64 - local_5c;
          local_c4 = local_5c - local_60;
          local_c8 = local_60;
          break;
        case '\x05':
          local_b4 = 1;
          local_bc = 0x10 - local_5c;
          local_c0 = local_5c - local_64;
          local_c4 = local_64 - local_60;
          local_c8 = local_60;
          break;
        case '\a':
          local_b4 = 1;
          local_b8 = local_20;
          local_bc = 0x10 - local_5c;
          local_c0 = local_5c - local_60;
          local_c4 = local_60 - local_64;
          local_c8 = local_64;
        }
        local_88[1] = local_88[0] + local_b4;
        local_88[2] = local_88[1] + local_b8;
        local_98[0] = local_bc;
        local_98[1] = local_c0;
        local_98[2] = local_c4;
        local_98[3] = local_c8;
        for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
          if (local_98[local_cc] != 0) {
            *(char *)(in_stack_00000010 + 0xd8 + (long)local_4c * 4 +
                     (ulong)*(byte *)(in_stack_00000010 + local_4c)) = (char)local_88[local_cc];
            *(char *)(in_stack_00000010 + 0x438 + (long)local_4c * 4 +
                     (ulong)*(byte *)(in_stack_00000010 + local_4c)) = (char)local_98[local_cc];
            *(char *)(in_stack_00000010 + local_4c) =
                 *(char *)(in_stack_00000010 + local_4c) + '\x01';
            *(char *)(in_stack_00000010 + 0x7d8 + (long)local_88[local_cc] * 0xd8 +
                     (ulong)*(byte *)(in_stack_00000010 + 0x798 + (long)local_88[local_cc])) =
                 (char)local_4c;
            *(char *)(in_stack_00000010 + 0x3dd8 + (long)local_88[local_cc] * 0xd8 +
                     (ulong)*(byte *)(in_stack_00000010 + 0x798 + (long)local_88[local_cc])) =
                 (char)local_98[local_cc];
            *(char *)(in_stack_00000010 + 0x798 + (long)local_88[local_cc]) =
                 *(char *)(in_stack_00000010 + 0x798 + (long)local_88[local_cc]) + '\x01';
            local_31 = astc::max<unsigned_char>
                                 (local_31,*(uchar *)(in_stack_00000010 + 0x798 +
                                                     (long)local_88[local_cc]));
          }
        }
      }
    }
  }
  local_cd = '\0';
  for (local_d4 = 0; local_d4 < local_2c; local_d4 = local_d4 + 1) {
    in_stack_00000008[(ulong)local_d4 + 0x20] = *(undefined1 *)(in_stack_00000010 + (ulong)local_d4)
    ;
    local_cd = astc::max<unsigned_char>(local_cd,in_stack_00000008[(ulong)local_d4 + 0x20]);
    for (local_d8 = 0; local_d8 < 4; local_d8 = local_d8 + 1) {
      in_stack_00000008[(ulong)local_d4 + (ulong)local_d8 * 0xd8 + 0x460] = 0;
      *(undefined4 *)(in_stack_00000008 + (ulong)local_d4 * 4 + (ulong)local_d8 * 0x360 + 0x7c0) = 0
      ;
      in_stack_00000008[(ulong)local_d4 + (ulong)local_d8 * 0xd8 + 0x100] = 0;
    }
    for (local_dc = 0; local_dc < *(byte *)(in_stack_00000010 + (ulong)local_d4);
        local_dc = local_dc + 1) {
      in_stack_00000008[(ulong)local_d4 + 0x460 + (ulong)local_dc * 0xd8] =
           *(undefined1 *)((ulong)local_dc + 0x438 + in_stack_00000010 + (ulong)local_d4 * 4);
      *(float *)(in_stack_00000008 + (ulong)local_d4 * 4 + (ulong)local_dc * 0x360 + 0x7c0) =
           (float)*(byte *)((ulong)local_dc + 0x438 + in_stack_00000010 + (ulong)local_d4 * 4) *
           0.0625;
      in_stack_00000008[(ulong)local_d4 + (ulong)local_dc * 0xd8 + 0x100] =
           *(undefined1 *)(in_stack_00000010 + 0xd8 + (ulong)local_d4 * 4 + (ulong)local_dc);
    }
  }
  in_stack_00000008[1] = local_cd;
  local_e0 = 0;
  do {
    if (local_30 <= local_e0) {
      for (local_108 = local_2c; local_108 < (local_2c + 7 & 0xfffffff8); local_108 = local_108 + 1)
      {
        in_stack_00000008[(ulong)local_108 + 0x20] = 0;
        for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
          *(undefined4 *)
           (in_stack_00000008 + (ulong)local_108 * 4 + (ulong)local_10c * 0x360 + 0x7c0) = 0;
          in_stack_00000008[(ulong)local_108 + (ulong)local_10c * 0xd8 + 0x100] = 0;
          in_stack_00000008[(ulong)local_108 + (ulong)local_10c * 0xd8 + 0x460] = 0;
        }
      }
      uVar2 = in_stack_00000008
              [(ulong)(local_30 - 1) +
               (long)(int)(*(byte *)(in_stack_00000010 + 0x798 + (ulong)(local_30 - 1)) - 1) * 0x40
               + 0x1580];
      for (local_11c = local_30; local_11c < (local_30 + 7 & 0xfffffff8); local_11c = local_11c + 1)
      {
        in_stack_00000008[(ulong)local_11c + 0x1540] = 0;
        for (local_120 = 0; local_120 < (int)(uint)local_31; local_120 = local_120 + 1) {
          in_stack_00000008[(ulong)local_11c + (long)local_120 * 0x40 + 0x1580] = uVar2;
          *(undefined4 *)
           (in_stack_00000008 + (ulong)local_11c * 4 + (long)local_120 * 0x100 + 0x4b80) = 0;
        }
      }
      *in_stack_00000008 = (char)local_2c;
      in_stack_00000008[2] = (char)local_30;
      in_stack_00000008[3] = (char)local_20;
      in_stack_00000008[4] = (char)local_24;
      in_stack_00000008[5] = (char)local_28;
      return;
    }
    bVar1 = *(byte *)(in_stack_00000010 + 0x798 + (ulong)local_e0);
    local_100 = (uint)bVar1;
    in_stack_00000008[(ulong)local_e0 + 0x1540] = bVar1;
    for (local_e8 = 0; local_e8 < local_100; local_e8 = local_e8 + 1) {
      bVar1 = *(byte *)((ulong)local_e8 + 0x7d8 + in_stack_00000010 + (ulong)local_e0 * 0xd8);
      uVar3 = (uint)bVar1;
      in_stack_00000008[(ulong)local_e0 + 0x1580 + (ulong)local_e8 * 0x40] = bVar1;
      *(float *)(in_stack_00000008 + (ulong)local_e0 * 4 + (ulong)local_e8 * 0x100 + 0x4b80) =
           (float)*(byte *)((ulong)local_e8 + 0x3dd8 + in_stack_00000010 + (ulong)local_e0 * 0xd8);
      *(undefined4 *)(in_stack_00000008 + (ulong)local_e0 * 4 + (ulong)local_e8 * 0x100 + 0x12380) =
           0;
      for (local_f0 = 0; local_f0 < 4; local_f0 = local_f0 + 1) {
        if (((byte)in_stack_00000008[(ulong)uVar3 + (ulong)local_f0 * 0xd8 + 0x100] == local_e0) &&
           ((*(float *)(in_stack_00000008 + (ulong)uVar3 * 4 + (ulong)local_f0 * 0x360 + 0x7c0) !=
             0.0 || (NAN(*(float *)(in_stack_00000008 +
                                   (ulong)uVar3 * 4 + (ulong)local_f0 * 0x360 + 0x7c0)))))) {
          *(undefined4 *)
           (in_stack_00000008 + (ulong)local_e0 * 4 + (ulong)local_e8 * 0x100 + 0x12380) =
               *(undefined4 *)
                (in_stack_00000008 + (ulong)uVar3 * 4 + (ulong)local_f0 * 0x360 + 0x7c0);
          break;
        }
      }
    }
    uVar2 = in_stack_00000008[(ulong)local_e0 + (ulong)(local_100 - 1) * 0x40 + 0x1580];
    for (; local_100 < local_31; local_100 = local_100 + 1) {
      in_stack_00000008[(ulong)local_e0 + (ulong)local_100 * 0x40 + 0x1580] = uVar2;
      *(undefined4 *)(in_stack_00000008 + (ulong)local_e0 * 4 + (ulong)local_100 * 0x100 + 0x4b80) =
           0;
    }
    local_e0 = local_e0 + 1;
  } while( true );
}

Assistant:

static void init_decimation_info_3d(
	unsigned int x_texels,
	unsigned int y_texels,
	unsigned int z_texels,
	unsigned int x_weights,
	unsigned int y_weights,
	unsigned int z_weights,
	decimation_info& di,
	dt_init_working_buffers& wb
) {
	unsigned int texels_per_block = x_texels * y_texels * z_texels;
	unsigned int weights_per_block = x_weights * y_weights * z_weights;

	uint8_t max_texel_count_of_weight = 0;

	promise(weights_per_block > 0);
	promise(texels_per_block > 0);

	for (unsigned int i = 0; i < weights_per_block; i++)
	{
		wb.texel_count_of_weight[i] = 0;
	}

	for (unsigned int i = 0; i < texels_per_block; i++)
	{
		wb.weight_count_of_texel[i] = 0;
	}

	for (unsigned int z = 0; z < z_texels; z++)
	{
		for (unsigned int y = 0; y < y_texels; y++)
		{
			for (unsigned int x = 0; x < x_texels; x++)
			{
				int texel = (z * y_texels + y) * x_texels + x;

				int x_weight = (((1024 + x_texels / 2) / (x_texels - 1)) * x * (x_weights - 1) + 32) >> 6;
				int y_weight = (((1024 + y_texels / 2) / (y_texels - 1)) * y * (y_weights - 1) + 32) >> 6;
				int z_weight = (((1024 + z_texels / 2) / (z_texels - 1)) * z * (z_weights - 1) + 32) >> 6;

				int x_weight_frac = x_weight & 0xF;
				int y_weight_frac = y_weight & 0xF;
				int z_weight_frac = z_weight & 0xF;
				int x_weight_int = x_weight >> 4;
				int y_weight_int = y_weight >> 4;
				int z_weight_int = z_weight >> 4;
				int qweight[4];
				int weight[4];
				qweight[0] = (z_weight_int * y_weights + y_weight_int) * x_weights + x_weight_int;
				qweight[3] = ((z_weight_int + 1) * y_weights + (y_weight_int + 1)) * x_weights + (x_weight_int + 1);

				// simplex interpolation
				int fs = x_weight_frac;
				int ft = y_weight_frac;
				int fp = z_weight_frac;

				int cas = ((fs > ft) << 2) + ((ft > fp) << 1) + ((fs > fp));
				int N = x_weights;
				int NM = x_weights * y_weights;

				int s1, s2, w0, w1, w2, w3;
				switch (cas)
				{
				case 7:
					s1 = 1;
					s2 = N;
					w0 = 16 - fs;
					w1 = fs - ft;
					w2 = ft - fp;
					w3 = fp;
					break;
				case 3:
					s1 = N;
					s2 = 1;
					w0 = 16 - ft;
					w1 = ft - fs;
					w2 = fs - fp;
					w3 = fp;
					break;
				case 5:
					s1 = 1;
					s2 = NM;
					w0 = 16 - fs;
					w1 = fs - fp;
					w2 = fp - ft;
					w3 = ft;
					break;
				case 4:
					s1 = NM;
					s2 = 1;
					w0 = 16 - fp;
					w1 = fp - fs;
					w2 = fs - ft;
					w3 = ft;
					break;
				case 2:
					s1 = N;
					s2 = NM;
					w0 = 16 - ft;
					w1 = ft - fp;
					w2 = fp - fs;
					w3 = fs;
					break;
				case 0:
					s1 = NM;
					s2 = N;
					w0 = 16 - fp;
					w1 = fp - ft;
					w2 = ft - fs;
					w3 = fs;
					break;
				default:
					s1 = NM;
					s2 = N;
					w0 = 16 - fp;
					w1 = fp - ft;
					w2 = ft - fs;
					w3 = fs;
					break;
				}

				qweight[1] = qweight[0] + s1;
				qweight[2] = qweight[1] + s2;
				weight[0] = w0;
				weight[1] = w1;
				weight[2] = w2;
				weight[3] = w3;

				for (unsigned int i = 0; i < 4; i++)
				{
					if (weight[i] != 0)
					{
						wb.grid_weights_of_texel[texel][wb.weight_count_of_texel[texel]] = static_cast<uint8_t>(qweight[i]);
						wb.weights_of_texel[texel][wb.weight_count_of_texel[texel]] = static_cast<uint8_t>(weight[i]);
						wb.weight_count_of_texel[texel]++;
						wb.texels_of_weight[qweight[i]][wb.texel_count_of_weight[qweight[i]]] = static_cast<uint8_t>(texel);
						wb.texel_weights_of_weight[qweight[i]][wb.texel_count_of_weight[qweight[i]]] = static_cast<uint8_t>(weight[i]);
						wb.texel_count_of_weight[qweight[i]]++;
						max_texel_count_of_weight = astc::max(max_texel_count_of_weight, wb.texel_count_of_weight[qweight[i]]);
					}
				}
			}
		}
	}

	uint8_t max_texel_weight_count = 0;
	for (unsigned int i = 0; i < texels_per_block; i++)
	{
		di.texel_weight_count[i] = wb.weight_count_of_texel[i];
		max_texel_weight_count = astc::max(max_texel_weight_count, di.texel_weight_count[i]);

		// Init all 4 entries so we can rely on zeros for vectorization
		for (unsigned int j = 0; j < 4; j++)
		{
			di.texel_weight_contribs_int_tr[j][i] = 0;
			di.texel_weight_contribs_float_tr[j][i] = 0.0f;
			di.texel_weights_tr[j][i] = 0;
		}

		for (unsigned int j = 0; j < wb.weight_count_of_texel[i]; j++)
		{
			di.texel_weight_contribs_int_tr[j][i] = wb.weights_of_texel[i][j];
			di.texel_weight_contribs_float_tr[j][i] = static_cast<float>(wb.weights_of_texel[i][j]) * (1.0f / WEIGHTS_TEXEL_SUM);
			di.texel_weights_tr[j][i] = wb.grid_weights_of_texel[i][j];
		}
	}

	di.max_texel_weight_count = max_texel_weight_count;

	for (unsigned int i = 0; i < weights_per_block; i++)
	{
		unsigned int texel_count_wt = wb.texel_count_of_weight[i];
		di.weight_texel_count[i] = static_cast<uint8_t>(texel_count_wt);

		for (unsigned int j = 0; j < texel_count_wt; j++)
		{
			unsigned int texel = wb.texels_of_weight[i][j];

			// Create transposed versions of these for better vectorization
			di.weight_texels_tr[j][i] = static_cast<uint8_t>(texel);
			di.weights_texel_contribs_tr[j][i] = static_cast<float>(wb.texel_weights_of_weight[i][j]);

			// Store the per-texel contribution of this weight for each texel it contributes to
			di.texel_contrib_for_weight[j][i] = 0.0f;
			for (unsigned int k = 0; k < 4; k++)
			{
				uint8_t dttw = di.texel_weights_tr[k][texel];
				float dttwf = di.texel_weight_contribs_float_tr[k][texel];
				if (dttw == i && dttwf != 0.0f)
				{
					di.texel_contrib_for_weight[j][i] = di.texel_weight_contribs_float_tr[k][texel];
					break;
				}
			}
		}

		// Initialize array tail so we can over-fetch with SIMD later to avoid loop tails
		// Match last texel in active lane in SIMD group, for better gathers
		uint8_t last_texel = di.weight_texels_tr[texel_count_wt - 1][i];
		for (unsigned int j = texel_count_wt; j < max_texel_count_of_weight; j++)
		{
			di.weight_texels_tr[j][i] = last_texel;
			di.weights_texel_contribs_tr[j][i] = 0.0f;
		}
	}

	// Initialize array tail so we can over-fetch with SIMD later to avoid loop tails
	unsigned int texels_per_block_simd = round_up_to_simd_multiple_vla(texels_per_block);
	for (unsigned int i = texels_per_block; i < texels_per_block_simd; i++)
	{
		di.texel_weight_count[i] = 0;

		for (unsigned int j = 0; j < 4; j++)
		{
			di.texel_weight_contribs_float_tr[j][i] = 0;
			di.texel_weights_tr[j][i] = 0;
			di.texel_weight_contribs_int_tr[j][i] = 0;
		}
	}

	// Initialize array tail so we can over-fetch with SIMD later to avoid loop tails
	// Match last texel in active lane in SIMD group, for better gathers
	int last_texel_count_wt = wb.texel_count_of_weight[weights_per_block - 1];
	uint8_t last_texel = di.weight_texels_tr[last_texel_count_wt - 1][weights_per_block - 1];

	unsigned int weights_per_block_simd = round_up_to_simd_multiple_vla(weights_per_block);
	for (unsigned int i = weights_per_block; i < weights_per_block_simd; i++)
	{
		di.weight_texel_count[i] = 0;

		for (int j = 0; j < max_texel_count_of_weight; j++)
		{
			di.weight_texels_tr[j][i] = last_texel;
			di.weights_texel_contribs_tr[j][i] = 0.0f;
		}
	}

	di.texel_count = static_cast<uint8_t>(texels_per_block);
	di.weight_count = static_cast<uint8_t>(weights_per_block);
	di.weight_x = static_cast<uint8_t>(x_weights);
	di.weight_y = static_cast<uint8_t>(y_weights);
	di.weight_z = static_cast<uint8_t>(z_weights);
}